

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.h
# Opt level: O1

GridHandle<pbrt::NanoVDBBuffer> *
nanovdb::io::readGrid<pbrt::NanoVDBBuffer>
          (GridHandle<pbrt::NanoVDBBuffer> *__return_storage_ptr__,istream *is,string *gridName,
          NanoVDBBuffer *buffer)

{
  size_t __n;
  size_t sVar1;
  undefined8 *puVar2;
  bool bVar3;
  int iVar4;
  byte *pbVar5;
  ssize_t sVar6;
  memory_resource *pmVar7;
  void *pvVar8;
  runtime_error *prVar9;
  byte bVar10;
  vector<nanovdb::io::GridMetaData,_std::allocator<nanovdb::io::GridMetaData>_> *__nbytes;
  vector<nanovdb::io::GridMetaData,_std::allocator<nanovdb::io::GridMetaData>_> *pvVar11;
  NanoVDBBuffer *__buf;
  NanoVDBBuffer *extraout_RDX;
  undefined8 *puVar12;
  _Ios_Seekdir _Var13;
  long lVar14;
  bool bVar15;
  uLongf numBytes;
  fileSize_t size;
  size_t local_a0;
  vector<nanovdb::io::GridMetaData,_std::allocator<nanovdb::io::GridMetaData>_> *local_98;
  size_t *local_90;
  NanoVDBBuffer *local_88;
  NanoVDBBuffer *local_80;
  ulong local_78;
  NanoVDBBuffer local_70;
  Segment local_58;
  
  pbVar5 = (byte *)(gridName->_M_dataplus)._M_p;
  if ((pbVar5 == (byte *)0x0) || (bVar10 = *pbVar5, bVar10 == 0)) {
    local_78 = 0;
  }
  else {
    local_78 = 0;
    do {
      pbVar5 = pbVar5 + 1;
      local_78 = (ulong)bVar10 + (local_78 >> 0x38) + local_78 * 0x43;
      bVar10 = *pbVar5;
    } while (bVar10 != 0);
  }
  __nbytes = &local_58.meta;
  local_58.header.magic = 0x304244566f6e614e;
  local_58.header.major = 0x13;
  __buf = &__return_storage_ptr__->mBuffer;
  local_90 = &(__return_storage_ptr__->mBuffer).bytesAllocated;
  local_58.header.minor = 0;
  local_58.header.gridCount = 0;
  local_58.header.codec = NONE;
  local_58.meta.
  super__Vector_base<nanovdb::io::GridMetaData,_std::allocator<nanovdb::io::GridMetaData>_>._M_impl.
  super__Vector_impl_data._M_start._0_2_ = 0;
  local_58.meta.
  super__Vector_base<nanovdb::io::GridMetaData,_std::allocator<nanovdb::io::GridMetaData>_>._M_impl.
  super__Vector_impl_data._M_start._2_6_ = 0;
  local_58.meta.
  super__Vector_base<nanovdb::io::GridMetaData,_std::allocator<nanovdb::io::GridMetaData>_>._M_impl.
  super__Vector_impl_data._M_finish._0_2_ = 0;
  local_58.meta.
  super__Vector_base<nanovdb::io::GridMetaData,_std::allocator<nanovdb::io::GridMetaData>_>._M_impl.
  super__Vector_impl_data._M_finish._2_6_ = 0;
  local_58.meta.
  super__Vector_base<nanovdb::io::GridMetaData,_std::allocator<nanovdb::io::GridMetaData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88 = __buf;
  local_80 = buffer;
  while (sVar6 = Segment::read(&local_58,(int)is,__buf,(size_t)__nbytes), (char)sVar6 != '\0') {
    puVar12 = (undefined8 *)
              CONCAT62(local_58.meta.
                       super__Vector_base<nanovdb::io::GridMetaData,_std::allocator<nanovdb::io::GridMetaData>_>
                       ._M_impl.super__Vector_impl_data._M_start._2_6_,
                       local_58.meta.
                       super__Vector_base<nanovdb::io::GridMetaData,_std::allocator<nanovdb::io::GridMetaData>_>
                       ._M_impl.super__Vector_impl_data._M_start._0_2_);
    puVar2 = (undefined8 *)
             CONCAT62(local_58.meta.
                      super__Vector_base<nanovdb::io::GridMetaData,_std::allocator<nanovdb::io::GridMetaData>_>
                      ._M_impl.super__Vector_impl_data._M_finish._2_6_,
                      local_58.meta.
                      super__Vector_base<nanovdb::io::GridMetaData,_std::allocator<nanovdb::io::GridMetaData>_>
                      ._M_impl.super__Vector_impl_data._M_finish._0_2_);
    bVar15 = puVar12 == puVar2;
    if (bVar15) {
      _Var13 = _S_beg;
    }
    else {
      lVar14 = 0;
      do {
        if (((puVar12[2] == local_78) && (__n = puVar12[0x13], __n == gridName->_M_string_length))
           && ((__n == 0 ||
               (iVar4 = bcmp((void *)puVar12[0x12],(gridName->_M_dataplus)._M_p,__n), iVar4 == 0))))
        {
          local_70.alloc.memoryResource = (local_80->alloc).memoryResource;
          local_70.bytesAllocated = 0;
          local_70.ptr = (uint8_t *)0x0;
          pbrt::NanoVDBBuffer::init(&local_70,(EVP_PKEY_CTX *)*puVar12);
          (__return_storage_ptr__->super_GridHandleBase)._vptr_GridHandleBase =
               (_func_int **)&PTR__GridHandle_0315d2b0;
          pmVar7 = pstd::pmr::new_delete_resource();
          (__return_storage_ptr__->mBuffer).alloc.memoryResource = pmVar7;
          *local_90 = 0;
          local_90[1] = 0;
          pbrt::NanoVDBBuffer::operator=(local_88,&local_70);
          pbrt::NanoVDBBuffer::clear(&local_70);
          std::istream::seekg((long)is,(_Ios_Seekdir)lVar14);
          sVar1 = (__return_storage_ptr__->mBuffer).bytesAllocated;
          __nbytes = (vector<nanovdb::io::GridMetaData,_std::allocator<nanovdb::io::GridMetaData>_>
                      *)(__return_storage_ptr__->mBuffer).ptr;
          if (local_58.header.codec == ZIP) {
            std::istream::read((char *)is,(long)&local_98);
            pvVar8 = operator_new__((ulong)local_98);
            std::istream::read((char *)is,(long)pvVar8);
            pvVar11 = local_98;
            local_a0 = sVar1;
            iVar4 = uncompress(__nbytes,&local_a0,pvVar8);
            __nbytes = pvVar11;
            if (iVar4 != 0) {
              std::runtime_error::runtime_error
                        ((runtime_error *)&local_70,"Internal read error in ZIP");
              std::runtime_error::~runtime_error((runtime_error *)&local_70);
              __nbytes = pvVar11;
            }
            if (local_a0 != sVar1) {
              prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar9,"UNZIP failed on byte size");
              __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            operator_delete__(pvVar8);
          }
          else {
            if (local_58.header.codec == BLOSC) {
              prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error
                        (prVar9,"BLOSC compression codec was disabled during build");
              goto LAB_003a71b4;
            }
            std::istream::read((char *)is,(long)__nbytes);
          }
          if (((byte)is[*(long *)(*(long *)is + -0x18) + 0x20] & 5) != 0) {
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar9,"Failed to read Tree from file");
LAB_003a71b4:
            __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          bVar3 = false;
        }
        else {
          lVar14 = lVar14 + puVar12[1];
          bVar3 = true;
        }
        _Var13 = (_Ios_Seekdir)lVar14;
        if (!bVar3) break;
        puVar12 = puVar12 + 0x16;
        bVar15 = puVar12 == puVar2;
      } while (!bVar15);
    }
    if (!bVar15) goto LAB_003a7125;
    std::istream::seekg((long)is,_Var13);
    __buf = extraout_RDX;
  }
  (__return_storage_ptr__->super_GridHandleBase)._vptr_GridHandleBase = (_func_int **)0x0;
  (__return_storage_ptr__->mBuffer).alloc.memoryResource = (memory_resource *)0x0;
  (__return_storage_ptr__->mBuffer).bytesAllocated = 0;
  (__return_storage_ptr__->mBuffer).ptr = (uint8_t *)0x0;
  (__return_storage_ptr__->super_GridHandleBase)._vptr_GridHandleBase =
       (_func_int **)&PTR__GridHandle_0315d2b0;
  pmVar7 = pstd::pmr::new_delete_resource();
  (__return_storage_ptr__->mBuffer).alloc.memoryResource = pmVar7;
  (__return_storage_ptr__->mBuffer).bytesAllocated = 0;
  (__return_storage_ptr__->mBuffer).ptr = (uint8_t *)0x0;
LAB_003a7125:
  std::vector<nanovdb::io::GridMetaData,_std::allocator<nanovdb::io::GridMetaData>_>::~vector
            (&local_58.meta);
  return __return_storage_ptr__;
}

Assistant:

GridHandle<BufferT> readGrid(std::istream& is, const std::string& gridName, const BufferT& buffer)
{
    const auto key = stringHash(gridName);
    Segment    s;
    while (s.read(is)) {
        std::streamoff seek = 0;
        for (auto& m : s.meta) {
            if (m.nameKey == key && m.gridName == gridName) { // check for hask key collision
                GridHandle<BufferT> handle(BufferT::create(m.gridSize, &buffer));
                is.seekg(seek, std::ios_base::cur); // rewind
                Internal::read(is, handle, s.header.codec);
                return handle;// is converted to r-value and return value is move constructed.
            } else {
                seek += m.fileSize;
            }
        }
        is.seekg(seek, std::ios_base::cur); // skip forward from the current position
    }
    return GridHandle<BufferT>();// empty handle
}